

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * ans_load_interp(uint8_t *in_u8)

{
  value_type vVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  reference pvVar5;
  uint *puVar6;
  uint32_t *n;
  byte *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  value_type cur;
  size_t sym;
  uint32_t max_norm_freq;
  uint32_t prev;
  uint32_t *in_ptr_u32;
  uint32_t frame_size;
  uint32_t max_sym;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec;
  allocator_type *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff80;
  ulong local_48;
  uint local_3c;
  value_type local_38;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar7;
  uint32_t *f;
  
  uVar2 = vbyte_decode_u32((uint8_t **)&stack0xfffffffffffffff0);
  n = (uint32_t *)(in_RSI + 1);
  iVar3 = 1 << (*in_RSI & 0x1f);
  uVar7 = 0;
  f = n;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x199d4b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x199d6e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x199d85);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  interpolative_internal::decode
            (f,(uint32_t *)CONCAT44(uVar2,iVar3),(size_t)n,CONCAT17(uVar7,in_stack_ffffffffffffffd8)
            );
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,0);
  local_3c = 0;
  local_38 = *pvVar5;
  for (local_48 = 1; local_48 <= uVar2; local_48 = local_48 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,local_48);
    vVar1 = *pvVar5;
    uVar4 = ~local_38;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,local_48);
    *pvVar5 = uVar4 + vVar1;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,local_48);
    puVar6 = std::max<unsigned_int>(&local_3c,pvVar5);
    local_3c = *puVar6;
    local_38 = vVar1;
  }
  return in_RDI;
}

Assistant:

std::vector<uint32_t> ans_load_interp(const uint8_t* in_u8)
{
    uint32_t max_sym = vbyte_decode_u32(in_u8);
    uint32_t frame_size = (1 << (*in_u8++));
    auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
    std::vector<uint32_t> vec(max_sym + 1);
    interpolative_internal::decode(
        in_ptr_u32, vec.data(), vec.size(), frame_size + vec.size() + 1);
    uint32_t prev = vec[0];
    uint32_t max_norm_freq = 0;
    for (size_t sym = 1; sym <= max_sym; sym++) {
        auto cur = vec[sym];
        vec[sym] = cur - prev - 1;
        max_norm_freq = std::max(max_norm_freq, vec[sym]);
        prev = cur;
    }
    return vec;
}